

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite_tar.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint iMode;
  char *pcVar2;
  char *zFile_1;
  unqlite_int64 nDataLen;
  unqlite_kv_cursor *pCur;
  char *zFile;
  unqlite_int64 nSize;
  void *pMap;
  int local_38;
  int rc;
  int i;
  int c;
  unqlite *pDb;
  int local_20;
  int db_iterate;
  int db_store;
  int db_extract;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  db_iterate = 0;
  local_20 = 0;
  pDb._4_4_ = 0;
  _db_store = argv;
  argv_local._0_4_ = argc;
  if (argc < 3) {
    Help();
  }
  rc = (int)*_db_store[2];
  if (rc != 0x2d) {
    Help();
  }
  rc = (int)_db_store[2][1];
  if ((rc == 0x69) || (rc == 0x49)) {
    pDb._4_4_ = 1;
  }
  else if ((rc == 0x77) || (rc == 0x57)) {
    local_20 = 1;
  }
  else {
    db_iterate = 1;
  }
  iMode = 0x101;
  if (local_20 != 0) {
    iMode = 4;
  }
  pMap._4_4_ = unqlite_open((unqlite **)&i,_db_store[1],iMode);
  if (pMap._4_4_ != 0) {
    Fatal((unqlite *)0x0,"Out of memory");
  }
  if (local_20 == 0) {
    if (pDb._4_4_ == 0) {
      for (local_38 = 3; local_38 < (int)argv_local; local_38 = local_38 + 1) {
        pcVar2 = _db_store[local_38];
        pMap._4_4_ = unqlite_kv_fetch_callback(_i,pcVar2,-1,DataConsumerCallback,(void *)0x0);
        if (pMap._4_4_ == -6) {
          printf("No such record: %s\n",pcVar2);
        }
      }
    }
    else {
      pMap._4_4_ = unqlite_kv_cursor_init(_i,(unqlite_kv_cursor **)&nDataLen);
      if (pMap._4_4_ != 0) {
        Fatal((unqlite *)0x0,"Out of memory");
      }
      unqlite_kv_cursor_first_entry((unqlite_kv_cursor *)nDataLen);
      while (iVar1 = unqlite_kv_cursor_valid_entry((unqlite_kv_cursor *)nDataLen), iVar1 != 0) {
        unqlite_kv_cursor_key_callback
                  ((unqlite_kv_cursor *)nDataLen,DataConsumerCallback,(void *)0x0);
        unqlite_kv_cursor_data((unqlite_kv_cursor *)nDataLen,(void *)0x0,(unqlite_int64 *)&zFile_1);
        printf(":\t %ld Bytes\n",zFile_1);
        unqlite_kv_cursor_next_entry((unqlite_kv_cursor *)nDataLen);
      }
      unqlite_kv_cursor_release(_i,(unqlite_kv_cursor *)nDataLen);
    }
  }
  else {
    for (local_38 = 3; local_38 < (int)argv_local; local_38 = local_38 + 1) {
      pCur = (unqlite_kv_cursor *)_db_store[local_38];
      printf("Inserting %s\t ... ",pCur);
      pMap._4_4_ = unqlite_util_load_mmaped_file
                             ((char *)pCur,(void **)&nSize,(unqlite_int64 *)&zFile);
      if (pMap._4_4_ == 0) {
        pMap._4_4_ = unqlite_kv_store(_i,pCur,-1,(void *)nSize,(unqlite_int64)zFile);
        unqlite_util_release_mmaped_file((void *)nSize,(unqlite_int64)zFile);
      }
      pcVar2 = "Fail";
      if (pMap._4_4_ == 0) {
        pcVar2 = "OK";
      }
      puts(pcVar2);
    }
    pMap._4_4_ = unqlite_commit(_i);
    if (pMap._4_4_ != 0) {
      pMap._4_4_ = unqlite_rollback(_i);
    }
    if (pMap._4_4_ != 0) {
      Fatal(_i,(char *)0x0);
    }
  }
  unqlite_close(_i);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	int db_extract = 0;          /* TRUE to extract records from the dabase */
	int db_store = 0;            /* TRUE to store files in the database */
	int db_iterate = 0;          /* TRUE to iterate over the inserted elements */
	unqlite *pDb;                /* Database handle */
	int c, i, rc;

	if (argc < 3) {
		/* Missing database name */
		Help();
	}

	c = argv[2][0];
	if (c != '-') {
		/* Missing command */
		Help();
	}
	c = argv[2][1];
	if (c == 'i' || c == 'I') {
		/* Iterate over the inserted elements */
		db_iterate = 1;
	}
	else if (c == 'w' || c == 'W') {
		/* Store some files */
		db_store = 1;
	}
	else {
		/* Extract some records */
		db_extract = 1;
	}


	/* Open our database */
	rc = unqlite_open(&pDb, argv[1], db_store ? UNQLITE_OPEN_CREATE : (UNQLITE_OPEN_READONLY | UNQLITE_OPEN_MMAP) /* Read-only DB */);
	if (rc != UNQLITE_OK) {
		Fatal(0, "Out of memory");
	}

	if (db_store) {
		void *pMap;          /* Read-only memory view of the target file */
		unqlite_int64 nSize; /* file size */

		/* Start the insertion */
		for (i = 3; i < argc; ++i) {
			const char *zFile = argv[i];
			printf("Inserting %s\t ... ", zFile);

			/* Obtain a read-only memory view of the whole file */
			rc = unqlite_util_load_mmaped_file(zFile, &pMap, &nSize);
			if (rc == UNQLITE_OK) {
				/* Store the whole file */
				rc = unqlite_kv_store(pDb, zFile, -1, pMap, nSize);
				/* Discard this view */
				unqlite_util_release_mmaped_file(pMap, nSize);
			}
			puts(rc == UNQLITE_OK ? "OK" : "Fail");
		}
		/* Manually commit the transaction.
		 * In fact, a call to unqlite_commit() is not necessary since UnQLite
		 * will automatically commit the transaction during a call to unqlite_close().
		 */
		rc = unqlite_commit(pDb);
		if (rc != UNQLITE_OK) {
			/* Rollback the transaction */
			rc = unqlite_rollback(pDb);
		}
		if (rc != UNQLITE_OK) {
			/* Something goes wrong, extract the database error log and exit */
			Fatal(pDb, 0);
		}
	}
	else if (db_iterate) {
		/* Iterate over the inserted records */
		unqlite_kv_cursor *pCur;

		/* Allocate a new cursor instance */
		rc = unqlite_kv_cursor_init(pDb, &pCur);
		if (rc != UNQLITE_OK) {
			Fatal(0, "Out of memory");
		}

		/* Point to the first record */
		unqlite_kv_cursor_first_entry(pCur);

		/* Iterate over the entries */
		while (unqlite_kv_cursor_valid_entry(pCur)) {
			unqlite_int64 nDataLen;

			/* Consume the key */
			unqlite_kv_cursor_key_callback(pCur, DataConsumerCallback, 0);

			/* Extract the data size */
			unqlite_kv_cursor_data(pCur, 0, &nDataLen);
			printf(":\t %l"NUM_FORMAT"d Bytes\n", nDataLen);
			/* unqlite_kv_cursor_data_callback(pCur,DataConsumerCallback,0); */

			/* Point to the next entry */
			unqlite_kv_cursor_next_entry(pCur);
		}
		/* Finally, Release our cursor */
		unqlite_kv_cursor_release(pDb, pCur);
	}
	else {
		/* Extract one more records */
		for (i = 3; i < argc; ++i) {
			const char *zFile = argv[i];
			rc = unqlite_kv_fetch_callback(pDb, zFile, -1, DataConsumerCallback, 0);
			if (rc == UNQLITE_NOTFOUND) {
				printf("No such record: %s\n", zFile);
			}
		}
	}

	/* All done, close our database */
	unqlite_close(pDb);
	return 0;
}